

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

TRef rec_cat(jit_State *J,BCReg baseslot,BCReg topslot)

{
  uint *puVar1;
  TRef *pTVar2;
  TRef *pTVar3;
  TValue TVar4;
  TValue TVar5;
  TValue TVar6;
  TValue TVar7;
  TValue TVar8;
  TValue TVar9;
  TRef TVar10;
  TRef TVar11;
  TValue *pTVar12;
  uint *puVar13;
  uint *puVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  BCReg BVar18;
  TValue savetv [6];
  RecordIndex ix;
  
  pTVar2 = J->base;
  for (BVar18 = baseslot; BVar18 <= topslot; BVar18 = BVar18 + 1) {
    if (J->base[BVar18] == 0) {
      sload(J,BVar18);
    }
  }
  puVar1 = pTVar2 + topslot;
  if ((((*puVar1 & 0x1f000000) == 0x4000000) || ((*puVar1 >> 0x18 & 0x1e) - 0xe < 6)) &&
     (((puVar1[-1] & 0x1f000000) == 0x4000000 || ((puVar1[-1] >> 0x18 & 0x1e) - 0xe < 6)))) {
    pTVar3 = J->base;
    lVar17 = -4 - (long)(pTVar2 + topslot);
    for (puVar13 = puVar1; pTVar3 + baseslot <= puVar13; puVar13 = puVar13 + -1) {
      uVar15 = *puVar13;
      if ((uVar15 >> 0x18 & 0x1e) - 0xe < 6) {
        (J->fold).ins.field_0.ot = 0x5d04;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar15;
        *(ushort *)((long)&(J->fold).ins + 2) = (ushort)((uVar15 & 0x1f000000) == 0xe000000);
        TVar10 = lj_opt_fold(J);
        *puVar13 = TVar10;
      }
      else if ((uVar15 & 0x1f000000) != 0x4000000) break;
      lVar17 = lVar17 + 4;
    }
    puVar13 = puVar13 + 1;
    TVar10 = lj_ir_kptr_(J,IR_KPTR,&J[-1].penalty[0x2f].val);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar10;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x55090000;
    TVar11 = lj_opt_fold(J);
    puVar14 = puVar13;
    TVar10 = TVar11;
    do {
      uVar15 = *puVar14;
      puVar14 = puVar14 + 1;
      (J->fold).ins.field_0.ot = 0x5689;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar10;
      (J->fold).ins.field_0.op2 = (IRRef1)uVar15;
      TVar10 = lj_opt_fold(J);
    } while (puVar14 <= puVar1);
    (J->fold).ins.field_0.ot = 0x5784;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar10;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
    ix.key = lj_opt_fold(J);
    BVar18 = (BCReg)((ulong)-(lVar17 + (long)J->base) >> 2);
    J->maxslot = BVar18;
    if (puVar13 == pTVar3 + baseslot) {
      return ix.key;
    }
    uVar15 = BVar18 - 1;
    J->maxslot = uVar15;
    *puVar13 = ix.key;
    ix.keyv.u64 = (ulong)&J[-1].penalty[0x2a].val | 0xfffd800000000000;
    pTVar12 = J->L->base;
  }
  else {
    uVar15 = topslot - 1;
    J->maxslot = uVar15;
    pTVar12 = J->L->base;
    ix.keyv = pTVar12[topslot];
    ix.key = *puVar1;
    puVar13 = puVar1;
  }
  uVar16 = (ulong)uVar15;
  ix.tabv = pTVar12[uVar16];
  ix.tab = puVar13[-1];
  TVar4 = pTVar12[uVar16];
  TVar5 = (pTVar12 + uVar16)[1];
  TVar6 = pTVar12[uVar16 + 2];
  TVar7 = (pTVar12 + uVar16 + 2)[1];
  TVar8 = pTVar12[uVar16 + 4];
  TVar9 = (pTVar12 + uVar16 + 4)[1];
  rec_mm_arith(J,&ix,MM_concat);
  pTVar12 = J->L->base;
  pTVar12[uVar16 + 4] = TVar8;
  (pTVar12 + uVar16 + 4)[1] = TVar9;
  pTVar12[uVar16 + 2] = TVar6;
  (pTVar12 + uVar16 + 2)[1] = TVar7;
  pTVar12[uVar16] = TVar4;
  (pTVar12 + uVar16)[1] = TVar5;
  return 0;
}

Assistant:

static TRef rec_cat(jit_State *J, BCReg baseslot, BCReg topslot)
{
  TRef *top = &J->base[topslot];
  TValue savetv[5+LJ_FR2];
  BCReg s;
  RecordIndex ix;
  lj_assertJ(baseslot < topslot, "bad CAT arg");
  for (s = baseslot; s <= topslot; s++)
    (void)getslot(J, s);  /* Ensure all arguments have a reference. */
  if (tref_isnumber_str(top[0]) && tref_isnumber_str(top[-1])) {
    TRef tr, hdr, *trp, *xbase, *base = &J->base[baseslot];
    /* First convert numbers to strings. */
    for (trp = top; trp >= base; trp--) {
      if (tref_isnumber(*trp))
	*trp = emitir(IRT(IR_TOSTR, IRT_STR), *trp,
		      tref_isnum(*trp) ? IRTOSTR_NUM : IRTOSTR_INT);
      else if (!tref_isstr(*trp))
	break;
    }
    xbase = ++trp;
    tr = hdr = emitir(IRT(IR_BUFHDR, IRT_PGC),
		      lj_ir_kptr(J, &J2G(J)->tmpbuf), IRBUFHDR_RESET);
    do {
      tr = emitir(IRTG(IR_BUFPUT, IRT_PGC), tr, *trp++);
    } while (trp <= top);
    tr = emitir(IRTG(IR_BUFSTR, IRT_STR), tr, hdr);
    J->maxslot = (BCReg)(xbase - J->base);
    if (xbase == base) return tr;  /* Return simple concatenation result. */
    /* Pass partial result. */
    topslot = J->maxslot--;
    *xbase = tr;
    top = xbase;
    setstrV(J->L, &ix.keyv, &J2G(J)->strempty);  /* Simulate string result. */
  } else {
    J->maxslot = topslot-1;
    copyTV(J->L, &ix.keyv, &J->L->base[topslot]);
  }
  copyTV(J->L, &ix.tabv, &J->L->base[topslot-1]);
  ix.tab = top[-1];
  ix.key = top[0];
  memcpy(savetv, &J->L->base[topslot-1], sizeof(savetv));  /* Save slots. */
  rec_mm_arith(J, &ix, MM_concat);  /* Call __concat metamethod. */
  memcpy(&J->L->base[topslot-1], savetv, sizeof(savetv));  /* Restore slots. */
  return 0;  /* No result yet. */
}